

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  int iVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Hello from the second CMake example!",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Version = ",10);
  iVar1 = examples::getVersion();
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int, char**) {

    std::cout << "Hello from the second CMake example!" << std::endl;
    std::cout << "Version = " << examples::getVersion() << std::endl;

    return 0;
}